

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O3

void ARGBShuffleRow_AVX2(uint8_t *src_argb,uint8_t *dst_argb,uint8_t *shuffler,int width)

{
  undefined1 (*pauVar1) [32];
  undefined1 auVar2 [32];
  bool bVar3;
  undefined1 auVar4 [32];
  int iVar5;
  undefined1 auVar6 [32];
  
  auVar6._16_16_ = *(undefined1 (*) [16])shuffler;
  auVar6._0_16_ = *(undefined1 (*) [16])shuffler;
  do {
    auVar2 = *(undefined1 (*) [32])src_argb;
    pauVar1 = (undefined1 (*) [32])((long)src_argb + 0x20);
    src_argb = (uint8_t *)((long)src_argb + 0x40);
    auVar2 = vpshufb_avx2(auVar2,auVar6);
    auVar4 = vpshufb_avx2(*pauVar1,auVar6);
    *(undefined1 (*) [32])dst_argb = auVar2;
    *(undefined1 (*) [32])((long)dst_argb + 0x20) = auVar4;
    dst_argb = (uint8_t *)((long)dst_argb + 0x40);
    iVar5 = width + -0x10;
    bVar3 = 0xf < width;
    width = iVar5;
  } while (iVar5 != 0 && bVar3);
  return;
}

Assistant:

void ARGBShuffleRow_AVX2(const uint8_t* src_argb,
                         uint8_t* dst_argb,
                         const uint8_t* shuffler,
                         int width) {
  asm volatile(

      "vbroadcastf128 (%3),%%ymm5                \n"

      LABELALIGN
      "1:                                        \n"
      "vmovdqu     (%0),%%ymm0                   \n"
      "vmovdqu     0x20(%0),%%ymm1               \n"
      "lea         0x40(%0),%0                   \n"
      "vpshufb     %%ymm5,%%ymm0,%%ymm0          \n"
      "vpshufb     %%ymm5,%%ymm1,%%ymm1          \n"
      "vmovdqu     %%ymm0,(%1)                   \n"
      "vmovdqu     %%ymm1,0x20(%1)               \n"
      "lea         0x40(%1),%1                   \n"
      "sub         $0x10,%2                      \n"
      "jg          1b                            \n"
      "vzeroupper                                \n"
      : "+r"(src_argb),  // %0
        "+r"(dst_argb),  // %1
        "+r"(width)      // %2
      : "r"(shuffler)    // %3
      : "memory", "cc", "xmm0", "xmm1", "xmm5");
}